

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedModuleElements.cpp
# Opt level: O3

void __thiscall
wasm::Analyzer::Analyzer
          (Analyzer *this,Module *module,PassOptions *options,
          vector<std::pair<wasm::ModuleElementKind,_wasm::Name>,_std::allocator<std::pair<wasm::ModuleElementKind,_wasm::Name>_>_>
          *roots)

{
  ModuleElement *pMVar1;
  bool bVar2;
  pair<wasm::ModuleElementKind,_wasm::Name> *element;
  ModuleElement *pMVar3;
  
  this->module = module;
  this->options = options;
  (this->used)._M_h._M_buckets = &(this->used)._M_h._M_single_bucket;
  (this->used)._M_h._M_bucket_count = 1;
  (this->used)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->used)._M_h._M_element_count = 0;
  (this->used)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->used)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->used)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->referenced)._M_h._M_buckets = &(this->referenced)._M_h._M_single_bucket;
  (this->referenced)._M_h._M_bucket_count = 1;
  (this->referenced)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->referenced)._M_h._M_element_count = 0;
  (this->referenced)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->referenced)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->referenced)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->moduleQueue).
  super__Vector_base<std::pair<wasm::ModuleElementKind,_wasm::Name>,_std::allocator<std::pair<wasm::ModuleElementKind,_wasm::Name>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->moduleQueue).
  super__Vector_base<std::pair<wasm::ModuleElementKind,_wasm::Name>,_std::allocator<std::pair<wasm::ModuleElementKind,_wasm::Name>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->moduleQueue).
  super__Vector_base<std::pair<wasm::ModuleElementKind,_wasm::Name>,_std::allocator<std::pair<wasm::ModuleElementKind,_wasm::Name>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->expressionQueue).
  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->expressionQueue).
  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->expressionQueue).
  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->calledSignatures)._M_h._M_buckets = &(this->calledSignatures)._M_h._M_single_bucket;
  (this->calledSignatures)._M_h._M_bucket_count = 1;
  (this->calledSignatures)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->calledSignatures)._M_h._M_element_count = 0;
  (this->calledSignatures)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->calledSignatures)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->calledSignatures)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->uncalledRefFuncMap)._M_h._M_buckets = &(this->uncalledRefFuncMap)._M_h._M_single_bucket;
  (this->uncalledRefFuncMap)._M_h._M_bucket_count = 1;
  (this->uncalledRefFuncMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->uncalledRefFuncMap)._M_h._M_element_count = 0;
  (this->uncalledRefFuncMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->uncalledRefFuncMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->uncalledRefFuncMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->readStructFields)._M_h._M_buckets = &(this->readStructFields)._M_h._M_single_bucket;
  (this->readStructFields)._M_h._M_bucket_count = 1;
  (this->readStructFields)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->readStructFields)._M_h._M_element_count = 0;
  (this->readStructFields)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->readStructFields)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->readStructFields)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->unreadStructFieldExprMap)._M_h._M_buckets =
       &(this->unreadStructFieldExprMap)._M_h._M_single_bucket;
  (this->unreadStructFieldExprMap)._M_h._M_bucket_count = 1;
  (this->unreadStructFieldExprMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->unreadStructFieldExprMap)._M_h._M_element_count = 0;
  (this->unreadStructFieldExprMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->unreadStructFieldExprMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->unreadStructFieldExprMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->subTypes).super__Optional_base<wasm::SubTypes,_false,_false>._M_payload.
  super__Optional_payload<wasm::SubTypes,_true,_false,_false>.
  super__Optional_payload_base<wasm::SubTypes>._M_engaged = false;
  pMVar1 = (roots->
           super__Vector_base<std::pair<wasm::ModuleElementKind,_wasm::Name>,_std::allocator<std::pair<wasm::ModuleElementKind,_wasm::Name>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pMVar3 = (roots->
                super__Vector_base<std::pair<wasm::ModuleElementKind,_wasm::Name>,_std::allocator<std::pair<wasm::ModuleElementKind,_wasm::Name>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pMVar3 != pMVar1; pMVar3 = pMVar3 + 1) {
    use(this,*pMVar3);
  }
  do {
    do {
      bVar2 = processExpressions(this);
    } while (bVar2);
    bVar2 = processModule(this);
  } while (bVar2);
  return;
}

Assistant:

Analyzer(Module* module,
           const PassOptions& options,
           const std::vector<ModuleElement>& roots)
    : module(module), options(options) {

    // All roots are used.
    for (auto& element : roots) {
      use(element);
    }

    // Main loop on both the module and the expression queues.
    while (processExpressions() || processModule()) {
    }
  }